

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_subexp_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  int iVar2;
  cram_external_type cVar3;
  uchar *puVar4;
  uint uVar5;
  int32_t *out_i;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  cram_external_type cVar9;
  long lVar10;
  cram_external_type cVar11;
  int iVar12;
  
  iVar2 = *out_size;
  if (0 < (long)iVar2) {
    cVar3 = (c->field_6).external.type;
    puVar4 = in->data;
    lVar10 = 0;
    do {
      sVar6 = in->byte;
      cVar11 = E_LONG;
      uVar8 = in->bit;
      do {
        bVar1 = puVar4[sVar6];
        uVar7 = uVar8 - 1;
        in->bit = uVar7;
        if (uVar8 == 0) {
          in->bit = 7;
          sVar6 = sVar6 + 1;
          in->byte = sVar6;
          uVar7 = 7;
        }
        cVar11 = cVar11 - E_INT;
        uVar5 = uVar8 & 0x1f;
        uVar8 = uVar7;
      } while ((bVar1 >> uVar5 & 1) != 0);
      if (cVar11 == E_INT) {
        if (cVar3 == 0) {
          iVar12 = 0;
        }
        else {
          sVar6 = in->byte;
          uVar8 = in->bit;
          iVar12 = 0;
          cVar11 = cVar3;
          do {
            iVar12 = (uint)((puVar4[sVar6] >> (uVar8 & 0x1f) & 1) != 0) + iVar12 * 2;
            sVar6 = sVar6 + ((int)uVar8 < 1);
            in->byte = sVar6;
            uVar8 = uVar8 - 1 & 7;
            in->bit = uVar8;
            cVar11 = cVar11 - E_INT;
          } while (cVar11 != 0);
        }
      }
      else {
        iVar12 = 0;
        if (cVar3 - cVar11 != 0) {
          sVar6 = in->byte;
          uVar8 = in->bit;
          iVar12 = 0;
          cVar9 = cVar3;
          do {
            iVar12 = (uint)((puVar4[sVar6] >> (uVar8 & 0x1f) & 1) != 0) + iVar12 * 2;
            sVar6 = sVar6 + ((int)uVar8 < 1);
            in->byte = sVar6;
            uVar8 = uVar8 - 1 & 7;
            in->bit = uVar8;
            cVar9 = cVar9 - E_INT;
          } while (cVar11 != cVar9);
        }
        iVar12 = (1 << ((byte)(cVar3 - cVar11) & 0x1f)) + iVar12;
      }
      *(int *)(out + lVar10 * 4) = iVar12 - (c->field_6).huffman.ncodes;
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int cram_subexp_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int n, count;
    int k = c->subexp.k;

    for (count = 0, n = *out_size; count < n; count++) {
	int i = 0, tail;
	int val;

	/* Get number of 1s */
	//while (get_bit_MSB(in) == 1) i++;
	i = get_one_bits_MSB(in);

	/*
	 * Val is
	 * i > 0:  2^(k+i-1) + k+i-1 bits
	 * i = 0:  k bits
	 */
	if (i) {
	    tail = i + k-1;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	    val += 1 << (i + k-1);
	} else {
	    tail = k;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	}

	out_i[count] = val - c->subexp.offset;
    }

    return 0;
}